

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::type_to_glsl_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t id,bool member)

{
  undefined4 uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  SPIRType *pSVar7;
  SPIRType *pSVar8;
  CompilerError *pCVar9;
  size_t sVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  undefined4 in_register_00000014;
  byte in_R8B;
  SPVFuncImpl local_334;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  undefined1 local_2d8 [44];
  uint32_t i;
  string sizes;
  __cxx11 local_288 [32];
  __cxx11 local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [32];
  string local_228 [32];
  SPIRVariable *local_208;
  SPIRVariable *var_2;
  SPIRVariable *local_1f8;
  SPIRVariable *var_1;
  char *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [38];
  allocator local_19a;
  allocator local_199;
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  spirv_cross local_158 [39];
  byte local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [7];
  bool old_is_using_builtin_array;
  spirv_cross local_110 [36];
  undefined4 local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  spirv_cross local_c8 [32];
  char *local_a8;
  char *wrapper_type;
  uint32_t local_98;
  bool buffer_desc;
  SPIRVariable *pSStack_90;
  bool ssbo;
  SPIRVariable *var;
  SPIRType *p_parent_type;
  string type_address_space;
  char *restrict_kw;
  string local_48 [8];
  string type_name;
  bool member_local;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *res;
  
  pSVar7 = (SPIRType *)CONCAT44(in_register_00000014,id);
  uVar11 = CONCAT71(in_register_00000009,member);
  uVar5 = (uint32_t)uVar11;
  bVar2 = in_R8B & 1;
  ::std::__cxx11::string::string(local_48);
  bVar3 = Compiler::is_pointer((Compiler *)type,pSVar7);
  if ((bVar3) || (bVar3 = Compiler::type_is_array_of_pointers((Compiler *)type,pSVar7), bVar3)) {
    if (pSVar7->pointer_depth == 0) {
      __assert_fail("type.pointer_depth > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x3e96,
                    "string spirv_cross::CompilerMSL::type_to_glsl(const SPIRType &, uint32_t, bool)"
                   );
    }
    get_type_address_space_abi_cxx11_((CompilerMSL *)&p_parent_type,type,id,member);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar7->parent_type);
    var = (SPIRVariable *)Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
    if ((bVar2 == 0) || (uVar5 == 0)) {
LAB_002eb4ca:
      bVar3 = Compiler::is_pointer((Compiler *)type,pSVar7);
      if ((bVar3) && (bVar3 = Compiler::is_pointer((Compiler *)type,(SPIRType *)var), bVar3)) {
        (*(type->super_IVariant)._vptr_IVariant[0x13])(local_130,type,var,uVar11 & 0xffffffff);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (local_110,local_130,(char (*) [2])0x40c6cb,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &p_parent_type,(char (*) [2])0x40c6cb);
        ::std::__cxx11::string::operator=(local_48,(string *)local_110);
        ::std::__cxx11::string::~string((string *)local_110);
        ::std::__cxx11::string::~string((string *)local_130);
      }
      else {
        while (bVar3 = Compiler::is_pointer((Compiler *)type,(SPIRType *)var), bVar3) {
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&var[1].dependees.buffer_capacity + 4));
          var = (SPIRVariable *)Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
        }
        local_131 = *(byte *)((long)&type[0x20].super_IVariant.self.id + 2) & 1;
        bVar3 = Compiler::is_physical_pointer((Compiler *)type,pSVar7);
        if (bVar3) {
          *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 0;
        }
        (*(type->super_IVariant)._vptr_IVariant[0x13])(local_178,type,var,uVar11 & 0xffffffff);
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                  (local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &p_parent_type,(char (*) [2])0x40c6cb,local_178);
        ::std::__cxx11::string::operator=(local_48,(string *)local_158);
        ::std::__cxx11::string::~string((string *)local_158);
        ::std::__cxx11::string::~string((string *)local_178);
        *(byte *)((long)&type[0x20].super_IVariant.self.id + 2) = local_131 & 1;
      }
      if (2 < pSVar7->basetype - Image) {
        ::std::__cxx11::string::operator+=(local_48,"*");
        pcVar6 = to_restrict((CompilerMSL *)type,uVar5,false);
        if (*pcVar6 != '\0') {
          ::std::__cxx11::string::operator+=(local_48," ");
          ::std::__cxx11::string::operator+=(local_48,pcVar6);
        }
      }
      ::std::__cxx11::string::string((string *)this,local_48);
    }
    else {
      pSStack_90 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)type,uVar5);
      bVar3 = is_var_runtime_size_array((CompilerMSL *)type,pSStack_90);
      if ((!bVar3) || (bVar3 = Compiler::is_runtime_size_array((SPIRType *)var), !bVar3))
      goto LAB_002eb4ca;
      local_98 = (var->super_IVariant).self.id;
      buffer_desc = Compiler::has_decoration((Compiler *)type,(ID)local_98,DecorationBufferBlock);
      if ((pSStack_90->storage == StorageClassStorageBuffer) ||
         (local_334 = SPVFuncImplNone, buffer_desc)) {
        local_334 = *(SPVFuncImpl *)&type[0x1c].member_name_cache._M_h._M_before_begin._M_nxt;
      }
      wrapper_type._7_1_ = local_334 & SPVFuncImplMod;
      local_a8 = "spvDescriptor";
      if (wrapper_type._7_1_ != SPVFuncImplNone) {
        local_a8 = "spvBufferDescriptor";
      }
      add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplVariableDescriptorArray);
      add_spv_func_and_recompile
                ((CompilerMSL *)type,
                 wrapper_type._7_1_ & SPVFuncImplMod | SPVFuncImplVariableDescriptor);
      (*(type->super_IVariant)._vptr_IVariant[0x13])(local_e8,type,var,uVar11 & 0xffffffff);
      join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4]>
                (local_c8,&local_a8,(char (*) [2])0x421795,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_parent_type
                 ,(char (*) [2])0x40c6cb,local_e8,(char (*) [4])" *>");
      ::std::__cxx11::string::operator=(local_48,(string *)local_c8);
      ::std::__cxx11::string::~string((string *)local_c8);
      ::std::__cxx11::string::~string((string *)local_e8);
      ::std::__cxx11::string::string((string *)this,local_48);
    }
    local_ec = 1;
    ::std::__cxx11::string::~string((string *)&p_parent_type);
    goto LAB_002ec4a7;
  }
  switch(pSVar7->basetype) {
  case Void:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"void",&local_199);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
    local_ec = 1;
    goto LAB_002ec4a7;
  case Boolean:
    local_1f8 = Compiler::maybe_get_backing_variable((Compiler *)type,uVar5);
    if ((local_1f8 != (SPIRVariable *)0x0) &&
       (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_1f8->basevariable),
       uVar4 != 0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_1f8->basevariable);
      local_1f8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)type,uVar4);
    }
    if ((((local_1f8 == (SPIRVariable *)0x0) || (local_1f8->storage != StorageClassWorkgroup)) &&
        (pSVar7->storage != StorageClassWorkgroup)) && (bVar2 == 0)) {
      ::std::__cxx11::string::operator=(local_48,"bool");
    }
    else {
      ::std::__cxx11::string::operator=(local_48,"short");
    }
    break;
  case SByte:
  case Char:
    ::std::__cxx11::string::operator=(local_48,"char");
    break;
  case UByte:
    ::std::__cxx11::string::operator=(local_48,"uchar");
    break;
  case Short:
    ::std::__cxx11::string::operator=(local_48,"short");
    break;
  case UShort:
    ::std::__cxx11::string::operator=(local_48,"ushort");
    break;
  case Int:
    ::std::__cxx11::string::operator=(local_48,"int");
    break;
  case UInt:
    ::std::__cxx11::string::operator=(local_48,"uint");
    break;
  case Int64:
    bVar3 = Options::supports_msl_version
                      ((Options *)
                       ((long)&type[0x1c].member_type_index_redirection.
                               super_VectorView<unsigned_int>.ptr + 4),2,2,0);
    if (!bVar3) {
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar9,"64-bit integers are only supported in MSL 2.2 and above.");
      __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=(local_48,"long");
    break;
  case UInt64:
    bVar3 = Options::supports_msl_version
                      ((Options *)
                       ((long)&type[0x1c].member_type_index_redirection.
                               super_VectorView<unsigned_int>.ptr + 4),2,2,0);
    if (!bVar3) {
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar9,"64-bit integers are only supported in MSL 2.2 and above.");
      __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=(local_48,"ulong");
    break;
  case AtomicCounter:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"atomic_uint",&local_19a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19a);
    local_ec = 1;
    goto LAB_002ec4a7;
  case Half:
    ::std::__cxx11::string::operator=(local_48,"half");
    break;
  case Float:
    ::std::__cxx11::string::operator=(local_48,"float");
    break;
  case Double:
    ::std::__cxx11::string::operator=(local_48,"double");
    break;
  case Struct:
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar7->super_IVariant).self);
    (*(type->super_IVariant)._vptr_IVariant[6])(local_198,type,(ulong)uVar4);
    ::std::__cxx11::string::operator=(local_48,local_198);
    ::std::__cxx11::string::~string(local_198);
    break;
  case Image:
  case SampledImage:
    (*(type->super_IVariant)._vptr_IVariant[0x17])
              (this,type,pSVar7,uVar11 & 0xffffffff,(ulong)bVar2);
    local_ec = 1;
    goto LAB_002ec4a7;
  case Sampler:
    sampler_type_abi_cxx11_(this,type,id,member);
    local_ec = 1;
    goto LAB_002ec4a7;
  case AccelerationStructure:
    bVar3 = Options::supports_msl_version
                      ((Options *)
                       ((long)&type[0x1c].member_type_index_redirection.
                               super_VectorView<unsigned_int>.ptr + 4),2,4,0);
    if (bVar3) {
      ::std::__cxx11::string::operator=
                (local_48,"raytracing::acceleration_structure<raytracing::instancing>");
    }
    else {
      bVar3 = Options::supports_msl_version
                        ((Options *)
                         ((long)&type[0x1c].member_type_index_redirection.
                                 super_VectorView<unsigned_int>.ptr + 4),2,3,0);
      if (!bVar3) {
        pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar9,"Acceleration Structure Type is supported in MSL 2.3 and above.");
        __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::__cxx11::string::operator=(local_48,"raytracing::instance_acceleration_structure");
    }
    break;
  case RayQuery:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)this,
               "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>",
               (allocator *)((long)&var_2 + 7));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_2 + 7));
    local_ec = 1;
    goto LAB_002ec4a7;
  case ControlPointArray:
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar7->parent_type);
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar5);
    (*(type->super_IVariant)._vptr_IVariant[0x13])(local_1c0,type,pSVar7,uVar11 & 0xffffffff);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [21])"patch_control_point<",local_1c0,
               (char (*) [2])0x4222ea);
    ::std::__cxx11::string::~string((string *)local_1c0);
    local_ec = 1;
    goto LAB_002ec4a7;
  case Interpolant:
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar7->parent_type);
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar5);
    (*(type->super_IVariant)._vptr_IVariant[0x13])(local_1e0,type,pSVar8,uVar11 & 0xffffffff);
    var_1._4_4_ = (pSVar7->super_IVariant).self.id;
    bVar3 = Compiler::has_decoration((Compiler *)type,var_1._4_4_,DecorationNoPerspective);
    local_1e8 = "centroid_perspective";
    if (bVar3) {
      local_1e8 = "centroid_no_perspective";
    }
    local_1e8 = local_1e8 + 9;
    join<char_const(&)[13],std::__cxx11::string,char_const(&)[18],char_const*,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [13])"interpolant<",local_1e0,
               (char (*) [18])", interpolation::",&local_1e8,(char (*) [2])0x4222ea);
    ::std::__cxx11::string::~string((string *)local_1e0);
    local_ec = 1;
    goto LAB_002ec4a7;
  case MeshGridProperties:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)this,"mesh_grid_properties",(allocator *)((long)&var_2 + 6));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_2 + 6));
    local_ec = 1;
    goto LAB_002ec4a7;
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"unknown_type",(allocator *)((long)&var_2 + 5));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_2 + 5));
    local_ec = 1;
    goto LAB_002ec4a7;
  }
  if (1 < pSVar7->columns) {
    local_208 = Compiler::maybe_get_backing_variable((Compiler *)type,uVar5);
    if ((local_208 != (SPIRVariable *)0x0) &&
       (uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_208->basevariable),
       uVar5 != 0)) {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_208->basevariable);
      local_208 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)type,uVar5);
    }
    if ((((local_208 != (SPIRVariable *)0x0) && (local_208->storage == StorageClassWorkgroup)) ||
        (pSVar7->storage == StorageClassWorkgroup)) &&
       (bVar3 = Options::supports_msl_version
                          ((Options *)
                           ((long)&type[0x1c].member_type_index_redirection.
                                   super_VectorView<unsigned_int>.ptr + 4),3,0,0), !bVar3)) {
      add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplStorageMatrix);
      ::std::operator+((char *)local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "spvStorage_");
      ::std::__cxx11::string::operator=(local_48,local_228);
      ::std::__cxx11::string::~string(local_228);
    }
    ::std::__cxx11::to_string(local_268,pSVar7->columns);
    ::std::operator+(local_248,(char *)local_268);
    ::std::__cxx11::string::operator+=(local_48,(string *)local_248);
    ::std::__cxx11::string::~string((string *)local_248);
    ::std::__cxx11::string::~string((string *)local_268);
  }
  if (1 < pSVar7->vecsize) {
    ::std::__cxx11::to_string(local_288,pSVar7->vecsize);
    ::std::__cxx11::string::operator+=(local_48,(string *)local_288);
    ::std::__cxx11::string::~string((string *)local_288);
  }
  bVar3 = VectorView<unsigned_int>::empty(&(pSVar7->array).super_VectorView<unsigned_int>);
  if ((bVar3) || (bVar3 = using_builtin_array((CompilerMSL *)type), bVar3)) {
    ::std::__cxx11::string::string((string *)this,local_48);
    local_ec = 1;
  }
  else {
    add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplUnsafeArray);
    ::std::__cxx11::string::string((string *)this);
    ::std::__cxx11::string::string((string *)(local_2d8 + 0x28));
    for (local_2d8._36_4_ = 0; uVar1 = local_2d8._36_4_,
        sVar10 = VectorView<unsigned_int>::size(&(pSVar7->array).super_VectorView<unsigned_int>),
        (uint)uVar1 < (uint)sVar10; local_2d8._36_4_ = local_2d8._36_4_ + 1) {
      ::std::__cxx11::string::operator+=((string *)this,"spvUnsafeArray<");
      ::std::__cxx11::string::operator+=((string *)(local_2d8 + 0x28),", ");
      CompilerGLSL::to_array_size_abi_cxx11_((CompilerGLSL *)local_2d8,type,id);
      ::std::__cxx11::string::operator+=((string *)(local_2d8 + 0x28),(string *)local_2d8);
      ::std::__cxx11::string::~string((string *)local_2d8);
      ::std::__cxx11::string::operator+=((string *)(local_2d8 + 0x28),">");
    }
    ::std::operator+(local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_2f8);
    ::std::__cxx11::string::~string((string *)local_2f8);
    local_ec = 1;
    ::std::__cxx11::string::~string((string *)(local_2d8 + 0x28));
  }
LAB_002ec4a7:
  ::std::__cxx11::string::~string(local_48);
  return this;
}

Assistant:

string CompilerMSL::type_to_glsl(const SPIRType &type, uint32_t id, bool member)
{
	string type_name;

	// Pointer?
	if (is_pointer(type) || type_is_array_of_pointers(type))
	{
		assert(type.pointer_depth > 0);

		const char *restrict_kw;

		auto type_address_space = get_type_address_space(type, id);
		const auto *p_parent_type = &get<SPIRType>(type.parent_type);

		// If we're wrapping buffer descriptors in a spvDescriptorArray, we'll have to handle it as a special case.
		if (member && id)
		{
			auto &var = get<SPIRVariable>(id);
			if (is_var_runtime_size_array(var) && is_runtime_size_array(*p_parent_type))
			{
				const bool ssbo = has_decoration(p_parent_type->self, DecorationBufferBlock);
				bool buffer_desc =
						(var.storage == StorageClassStorageBuffer || ssbo) &&
						msl_options.runtime_array_rich_descriptor;

				const char *wrapper_type = buffer_desc ? "spvBufferDescriptor" : "spvDescriptor";
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
				add_spv_func_and_recompile(buffer_desc ? SPVFuncImplVariableSizedDescriptor : SPVFuncImplVariableDescriptor);

				type_name = join(wrapper_type, "<", type_address_space, " ", type_to_glsl(*p_parent_type, id), " *>");
				return type_name;
			}
		}

		// Work around C pointer qualifier rules. If glsl_type is a pointer type as well
		// we'll need to emit the address space to the right.
		// We could always go this route, but it makes the code unnatural.
		// Prefer emitting thread T *foo over T thread* foo since it's more readable,
		// but we'll have to emit thread T * thread * T constant bar; for example.
		if (is_pointer(type) && is_pointer(*p_parent_type))
			type_name = join(type_to_glsl(*p_parent_type, id), " ", type_address_space, " ");
		else
		{
			// Since this is not a pointer-to-pointer, ensure we've dug down to the base type.
			// Some situations chain pointers even though they are not formally pointers-of-pointers.
			while (is_pointer(*p_parent_type))
				p_parent_type = &get<SPIRType>(p_parent_type->parent_type);

			// If we're emitting BDA, just use the templated type.
			// Emitting builtin arrays need a lot of cooperation with other code to ensure
			// the C-style nesting works right.
			// FIXME: This is somewhat of a hack.
			bool old_is_using_builtin_array = is_using_builtin_array;
			if (is_physical_pointer(type))
				is_using_builtin_array = false;

			type_name = join(type_address_space, " ", type_to_glsl(*p_parent_type, id));

			is_using_builtin_array = old_is_using_builtin_array;
		}

		switch (type.basetype)
		{
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::Sampler:
			// These are handles.
			break;
		default:
			// Anything else can be a raw pointer.
			type_name += "*";
			restrict_kw = to_restrict(id, false);
			if (*restrict_kw)
			{
				type_name += " ";
				type_name += restrict_kw;
			}
			break;
		}
		return type_name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		// Allow Metal to use the array<T> template to make arrays a value type
		type_name = to_name(type.self);
		break;

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id, member);

	case SPIRType::Sampler:
		return sampler_type(type, id, member);

	case SPIRType::Void:
		return "void";

	case SPIRType::AtomicCounter:
		return "atomic_uint";

	case SPIRType::ControlPointArray:
		return join("patch_control_point<", type_to_glsl(get<SPIRType>(type.parent_type), id), ">");

	case SPIRType::Interpolant:
		return join("interpolant<", type_to_glsl(get<SPIRType>(type.parent_type), id), ", interpolation::",
		            has_decoration(type.self, DecorationNoPerspective) ? "no_perspective" : "perspective", ">");

	// Scalars
	case SPIRType::Boolean:
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup booleans. They are supposed to be logical
		// storage, but MSL compilers will sometimes crash if you use threadgroup bool.
		// Workaround this by using 16-bit types instead and fixup on load-store to this data.
		if ((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup || member)
			type_name = "short";
		else
			type_name = "bool";
		break;
	}

	case SPIRType::Char:
	case SPIRType::SByte:
		type_name = "char";
		break;
	case SPIRType::UByte:
		type_name = "uchar";
		break;
	case SPIRType::Short:
		type_name = "short";
		break;
	case SPIRType::UShort:
		type_name = "ushort";
		break;
	case SPIRType::Int:
		type_name = "int";
		break;
	case SPIRType::UInt:
		type_name = "uint";
		break;
	case SPIRType::Int64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "long";
		break;
	case SPIRType::UInt64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "ulong";
		break;
	case SPIRType::Half:
		type_name = "half";
		break;
	case SPIRType::Float:
		type_name = "float";
		break;
	case SPIRType::Double:
		type_name = "double"; // Currently unsupported
		break;
	case SPIRType::AccelerationStructure:
		if (msl_options.supports_msl_version(2, 4))
			type_name = "raytracing::acceleration_structure<raytracing::instancing>";
		else if (msl_options.supports_msl_version(2, 3))
			type_name = "raytracing::instance_acceleration_structure";
		else
			SPIRV_CROSS_THROW("Acceleration Structure Type is supported in MSL 2.3 and above.");
		break;
	case SPIRType::RayQuery:
		return "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>";
	case SPIRType::MeshGridProperties:
		return "mesh_grid_properties";

	default:
		return "unknown_type";
	}

	// Matrix?
	if (type.columns > 1)
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup matrices. Due to an oversight, Metal's
		// matrix struct prior to Metal 3 lacks constructors in the threadgroup AS,
		// preventing us from default-constructing or initializing matrices in threadgroup storage.
		// Work around this by using our own type as storage.
		if (((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup) &&
		    !msl_options.supports_msl_version(3, 0))
		{
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			type_name = "spvStorage_" + type_name;
		}

		type_name += to_string(type.columns) + "x";
	}

	// Vector or Matrix?
	if (type.vecsize > 1)
		type_name += to_string(type.vecsize);

	if (type.array.empty() || using_builtin_array())
	{
		return type_name;
	}
	else
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		add_spv_func_and_recompile(SPVFuncImplUnsafeArray);
		string res;
		string sizes;

		for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		{
			res += "spvUnsafeArray<";
			sizes += ", ";
			sizes += to_array_size(type, i);
			sizes += ">";
		}

		res += type_name + sizes;
		return res;
	}
}